

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::DataParameter::set_backend(DataParameter *this,DataParameter_DB value)

{
  if (value < 2) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
    this->backend_ = value;
    return;
  }
  __assert_fail("::caffe::DataParameter_DB_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x4851,"void caffe::DataParameter::set_backend(::caffe::DataParameter_DB)");
}

Assistant:

bool DataParameter_DB_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}